

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

void nvlist_destroy(nvlist_t *nvl)

{
  int iVar1;
  int *piVar2;
  nvpair_t *nvp_00;
  int _serrno;
  nvpair_t *nvp;
  nvlist_t *nvl_local;
  
  if (nvl != (nvlist_t *)0x0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if (nvl == (nvlist_t *)0x0) {
      __assert_fail("(nvl) != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                    ,0x8d,"void nvlist_destroy(nvlist_t *)");
    }
    if (nvl->nvl_magic != 0x6e766c) {
      __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                    ,0x8d,"void nvlist_destroy(nvlist_t *)");
    }
    while (nvp_00 = nvlist_first_nvpair(nvl), nvp_00 != (nvpair_t *)0x0) {
      nvlist_remove_nvpair(nvl,nvp_00);
      nvpair_free(nvp_00);
    }
    if (nvl->nvl_array_next != (nvpair_t *)0x0) {
      nvpair_free_structure(nvl->nvl_array_next);
    }
    nvl->nvl_array_next = (nvpair_t *)0x0;
    nvl->nvl_parent = (nvpair_t *)0x0;
    nvl->nvl_magic = 0;
    free(nvl);
    piVar2 = __errno_location();
    *piVar2 = iVar1;
  }
  return;
}

Assistant:

void
nvlist_destroy(nvlist_t *nvl)
{
	nvpair_t *nvp;

	if (nvl == NULL)
		return;

	ERRNO_SAVE();

	NVLIST_ASSERT(nvl);

	while ((nvp = nvlist_first_nvpair(nvl)) != NULL) {
		nvlist_remove_nvpair(nvl, nvp);
		nvpair_free(nvp);
	}
	if (nvl->nvl_array_next != NULL)
		nvpair_free_structure(nvl->nvl_array_next);
	nvl->nvl_array_next = NULL;
	nvl->nvl_parent = NULL;
	nvl->nvl_magic = 0;
	nv_free(nvl);

	ERRNO_RESTORE();
}